

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

Tim_Man_t * Tim_ManTrim(Tim_Man_t *p,Vec_Int_t *vBoxPres)

{
  float fVar1;
  float fVar2;
  Tim_Obj_t *pTVar3;
  Tim_Obj_t *pTVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  Vec_Ptr_t *pVVar10;
  float *pfVar11;
  float *Entry;
  bool bVar12;
  int local_e4;
  int local_68;
  int local_64;
  int curPo;
  int curPi;
  int nOutputs;
  int nInputs;
  int nNewCos;
  int nNewCis;
  int k;
  int i;
  float *pDelayTableNew;
  float *pDelayTable;
  Tim_Obj_t *pObj;
  Tim_Box_t *pBox;
  Tim_Man_t *pNew;
  Vec_Int_t *vBoxPres_local;
  Tim_Man_t *p_local;
  
  iVar5 = Vec_IntSize(vBoxPres);
  iVar6 = Tim_ManBoxNum(p);
  if (iVar5 != iVar6) {
    __assert_fail("Vec_IntSize(vBoxPres) == Tim_ManBoxNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                  ,0xad,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
  }
  nInputs = Tim_ManPiNum(p);
  nOutputs = Tim_ManPoNum(p);
  iVar5 = Tim_ManBoxNum(p);
  if (iVar5 != 0) {
    for (nNewCis = 0; iVar5 = Vec_PtrSize(p->vBoxes), nNewCis < iVar5; nNewCis = nNewCis + 1) {
      pvVar9 = Vec_PtrEntry(p->vBoxes,nNewCis);
      iVar5 = Vec_IntEntry(vBoxPres,nNewCis);
      if (iVar5 != 0) {
        nInputs = *(int *)((long)pvVar9 + 0xc) + nInputs;
        nOutputs = *(int *)((long)pvVar9 + 8) + nOutputs;
      }
    }
  }
  iVar5 = Tim_ManCiNum(p);
  if ((nInputs == iVar5) && (iVar5 = Tim_ManCoNum(p), nOutputs == iVar5)) {
    p_local = Tim_ManDup(p,0);
  }
  else {
    iVar5 = Tim_ManCiNum(p);
    if (iVar5 <= nInputs) {
      __assert_fail("nNewCis < Tim_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                    ,0xba,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
    }
    iVar5 = Tim_ManCoNum(p);
    if (iVar5 <= nOutputs) {
      __assert_fail("nNewCos < Tim_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                    ,0xbb,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
    }
    nNewCis = 0;
    while( true ) {
      bVar12 = false;
      if (nNewCis < p->nCis) {
        pDelayTable = (float *)(p->pCis + nNewCis);
        bVar12 = (Tim_Obj_t *)pDelayTable != (Tim_Obj_t *)0x0;
      }
      if (!bVar12) break;
      pDelayTable[1] = 0.0;
      nNewCis = nNewCis + 1;
    }
    nNewCis = 0;
    while( true ) {
      bVar12 = false;
      if (nNewCis < p->nCos) {
        pDelayTable = (float *)(p->pCos + nNewCis);
        bVar12 = (Tim_Obj_t *)pDelayTable != (Tim_Obj_t *)0x0;
      }
      if (!bVar12) break;
      pDelayTable[1] = 0.0;
      nNewCis = nNewCis + 1;
    }
    p_local = Tim_ManStart(nInputs,nOutputs);
    pTVar3 = p_local->pCis;
    pTVar4 = p->pCis;
    iVar5 = Tim_ManPiNum(p);
    memcpy(pTVar3,pTVar4,(long)iVar5 * 0x18);
    pTVar3 = p_local->pCos;
    iVar5 = Tim_ManPoNum(p);
    pTVar4 = p->pCos;
    iVar6 = Tim_ManCoNum(p);
    iVar7 = Tim_ManPoNum(p);
    iVar8 = Tim_ManPoNum(p);
    memcpy(pTVar3 + ((long)nOutputs - (long)iVar5),pTVar4 + ((long)iVar6 - (long)iVar7),
           (long)iVar8 * 0x18);
    iVar5 = Tim_ManDelayTableNum(p);
    if (0 < iVar5) {
      iVar5 = Vec_PtrSize(p->vDelayTables);
      pVVar10 = Vec_PtrStart(iVar5);
      p_local->vDelayTables = pVVar10;
      for (nNewCis = 0; iVar5 = Vec_PtrSize(p->vDelayTables), nNewCis < iVar5; nNewCis = nNewCis + 1
          ) {
        pfVar11 = (float *)Vec_PtrEntry(p->vDelayTables,nNewCis);
        if (pfVar11 != (float *)0x0) {
          if (nNewCis != (int)*pfVar11) {
            __assert_fail("i == (int)pDelayTable[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                          ,0xd0,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
          }
          fVar1 = pfVar11[1];
          fVar2 = pfVar11[2];
          Entry = (float *)malloc((long)((int)fVar1 * (int)fVar2 + 3) << 2);
          *Entry = (float)(int)*pfVar11;
          Entry[1] = (float)(int)pfVar11[1];
          Entry[2] = (float)(int)pfVar11[2];
          for (nNewCos = 0; nNewCos < (int)fVar1 * (int)fVar2; nNewCos = nNewCos + 1) {
            Entry[nNewCos + 3] = pfVar11[nNewCos + 3];
          }
          pvVar9 = Vec_PtrEntry(p_local->vDelayTables,nNewCis);
          if (pvVar9 != (void *)0x0) {
            __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                          ,0xda,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
          }
          Vec_PtrWriteEntry(p_local->vDelayTables,nNewCis,Entry);
        }
      }
    }
    iVar5 = Tim_ManBoxNum(p);
    if (0 < iVar5) {
      local_64 = Tim_ManPiNum(p);
      local_68 = 0;
      iVar5 = Tim_ManBoxNum(p);
      pVVar10 = Vec_PtrAlloc(iVar5);
      p_local->vBoxes = pVVar10;
      for (nNewCis = 0; iVar5 = Vec_PtrSize(p->vBoxes), nNewCis < iVar5; nNewCis = nNewCis + 1) {
        pvVar9 = Vec_PtrEntry(p->vBoxes,nNewCis);
        iVar5 = Vec_IntEntry(vBoxPres,nNewCis);
        if (iVar5 != 0) {
          Tim_ManCreateBox(p_local,local_68,*(int *)((long)pvVar9 + 8),local_64,
                           *(int *)((long)pvVar9 + 0xc),*(int *)((long)pvVar9 + 0x10),
                           *(int *)((long)pvVar9 + 0x18));
          iVar5 = Tim_ManBoxNum(p_local);
          iVar6 = Tim_ManBoxCopy(p,nNewCis);
          if (iVar6 == -1) {
            local_e4 = nNewCis;
          }
          else {
            local_e4 = Tim_ManBoxCopy(p,nNewCis);
          }
          Tim_ManBoxSetCopy(p_local,iVar5 + -1,local_e4);
          local_64 = *(int *)((long)pvVar9 + 0xc) + local_64;
          local_68 = *(int *)((long)pvVar9 + 8) + local_68;
        }
      }
      iVar5 = Tim_ManPoNum(p);
      iVar6 = Tim_ManCiNum(p_local);
      if (local_64 != iVar6) {
        __assert_fail("curPi == Tim_ManCiNum(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                      ,0xed,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
      }
      iVar6 = Tim_ManCoNum(p_local);
      if (iVar5 + local_68 != iVar6) {
        __assert_fail("curPo == Tim_ManCoNum(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timMan.c"
                      ,0xee,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
      }
    }
  }
  return p_local;
}

Assistant:

Tim_Man_t * Tim_ManTrim( Tim_Man_t * p, Vec_Int_t * vBoxPres )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, nNewCis, nNewCos, nInputs, nOutputs;
    assert( Vec_IntSize(vBoxPres) == Tim_ManBoxNum(p) );
    // count the number of CIs and COs in the trimmed manager
    nNewCis = Tim_ManPiNum(p);
    nNewCos = Tim_ManPoNum(p);
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
            if ( Vec_IntEntry(vBoxPres, i) )
            {
                nNewCis += pBox->nOutputs;
                nNewCos += pBox->nInputs;
            }
    if ( nNewCis == Tim_ManCiNum(p) && nNewCos == Tim_ManCoNum(p) )
        return Tim_ManDup( p, 0 );
    assert( nNewCis < Tim_ManCiNum(p) );
    assert( nNewCos < Tim_ManCoNum(p) );
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( nNewCis, nNewCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * Tim_ManPiNum(p) );
    memcpy( pNew->pCos + nNewCos - Tim_ManPoNum(p), 
            p->pCos + Tim_ManCoNum(p) - Tim_ManPoNum(p), 
            sizeof(Tim_Obj_t) * Tim_ManPoNum(p) );
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = (int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
                pDelayTableNew[3+k] = pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        int curPi = Tim_ManPiNum(p);
        int curPo = 0;
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Tim_ManForEachBox( p, pBox, i )
            if ( Vec_IntEntry(vBoxPres, i) )
            {
                Tim_ManCreateBox( pNew, curPo, pBox->nInputs, curPi, pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
                Tim_ManBoxSetCopy( pNew, Tim_ManBoxNum(pNew) - 1, Tim_ManBoxCopy(p, i) == -1 ? i : Tim_ManBoxCopy(p, i) );
                curPi += pBox->nOutputs;
                curPo += pBox->nInputs;
            }
        curPo += Tim_ManPoNum(p);
        assert( curPi == Tim_ManCiNum(pNew) );
        assert( curPo == Tim_ManCoNum(pNew) );
    }
    return pNew;
}